

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  void *alloc;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  ZSTD_CCtx_params in_stack_fffffffffffffe68;
  undefined1 local_e0 [12];
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined8 uStack_c8;
  undefined4 local_c0;
  int local_50;
  
  bVar8 = 0;
  iVar5 = 2 - (uint)(cParams.windowLog < 0xf);
  if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    iVar5 = 1;
  }
  uVar4 = (2L << ((byte)cParams.hashLog & 0x3f)) + 0x3fU & 0xffffffffffffffc0;
  if (iVar5 != 2) {
    uVar4 = 0;
  }
  if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    uVar4 = 0;
  }
  lVar2 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2cd0;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar2 = 0x2cd0;
  }
  if ((((ulong)workspace & 7) == 0) && (workspace != (void *)0x0 && 0x138f < (long)workspaceSize)) {
    lVar1 = (long)workspace + 0x1390;
    *(void **)((long)workspace + 0x20) = workspace;
    *(size_t *)((long)workspace + 0x28) = (long)workspace + workspaceSize;
    *(long *)((long)workspace + 0x30) = lVar1;
    *(long *)((long)workspace + 0x38) = lVar1;
    *(long *)((long)workspace + 0x40) = lVar1;
    *(size_t *)((long)workspace + 0x48) = (long)workspace + workspaceSize;
    *(undefined1 *)((long)workspace + 0x50) = 0;
    *(undefined8 *)((long)workspace + 0x54) = 0;
    *(undefined4 *)((long)workspace + 0x5c) = 1;
    if (uVar4 + lVar2 + (4L << ((byte)cParams.chainLog & 0x3f)) +
                (4L << ((byte)cParams.hashLog & 0x3f)) <= workspaceSize) {
      memset(local_e0,0,0xb0);
      local_c0 = 1;
      local_e0._4_8_ = cParams._0_8_;
      uStack_d4 = cParams.hashLog;
      uStack_d0 = cParams.searchLog;
      uStack_cc = cParams.minMatch;
      uStack_c8 = cParams._20_8_;
      local_50 = iVar5;
      *(int *)((long)workspace + 5000) = iVar5;
      puVar6 = (undefined8 *)local_e0;
      puVar7 = (undefined8 *)&stack0xfffffffffffffe68;
      for (lVar2 = 0x16; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar7 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      sVar3 = ZSTD_initCDict_internal
                        ((ZSTD_CDict *)workspace,dict,dictSize,dictLoadMethod,dictContentType,
                         in_stack_fffffffffffffe68);
      if (sVar3 < 0xffffffffffffff89) {
        return (ZSTD_CDict *)workspace;
      }
      return (ZSTD_CDict *)0x0;
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_useRowMatchFinderMode_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_urm_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}